

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O0

Graphics * __thiscall
Game::Graphics::GameScoreBoardOverlay(Graphics *this,scoreboard_display_data_t *scdd)

{
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  anon_class_112_2_1b08a655 local_200;
  ostringstream local_190 [8];
  ostringstream str_os;
  scoreboard_display_data_t *scdd_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple(&local_268,scdd);
  DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>
            (&local_200,&local_268,GameScoreBoardBox);
  DrawAlways<DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>))::_lambda()_1_>
            ((ostream *)local_190,&local_200);
  DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>))
  ::{lambda()#1}::~DataSuppliment((_lambda___1_ *)&local_200);
  std::
  tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_268);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string GameScoreBoardOverlay(scoreboard_display_data_t scdd) {
  std::ostringstream str_os;
  DrawAlways(str_os, DataSuppliment(scdd, GameScoreBoardBox));
  return str_os.str();
}